

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void ARGBToARGB4444Row_C(uint8 *src_argb,uint8 *dst_rgb,int width)

{
  int iVar1;
  
  if (1 < width) {
    iVar1 = 0;
    do {
      *(uint *)dst_rgb =
           (src_argb[7] & 0xfffffff0) << 0x18 | (src_argb[6] & 0xf0) << 0x14 |
           (src_argb[5] & 0xf0) << 0x10 |
           (src_argb[4] & 0xf0) << 0xc |
           (src_argb[3] & 0xf0) << 8 |
           (src_argb[2] & 0xf0) << 4 | src_argb[1] & 0xfffffff0 | (uint)(*src_argb >> 4);
      dst_rgb = (uint8 *)((long)dst_rgb + 4);
      src_argb = src_argb + 8;
      iVar1 = iVar1 + 2;
    } while (iVar1 < width + -1);
  }
  if ((width & 1U) != 0) {
    *(ushort *)dst_rgb =
         (src_argb[3] & 0xfff0) << 8 |
         (src_argb[2] & 0xf0) << 4 | src_argb[1] & 0xfff0 | (ushort)(*src_argb >> 4);
  }
  return;
}

Assistant:

void ARGBToARGB4444Row_C(const uint8* src_argb, uint8* dst_rgb, int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    uint8 b0 = src_argb[0] >> 4;
    uint8 g0 = src_argb[1] >> 4;
    uint8 r0 = src_argb[2] >> 4;
    uint8 a0 = src_argb[3] >> 4;
    uint8 b1 = src_argb[4] >> 4;
    uint8 g1 = src_argb[5] >> 4;
    uint8 r1 = src_argb[6] >> 4;
    uint8 a1 = src_argb[7] >> 4;
    *(uint32*)(dst_rgb) = b0 | (g0 << 4) | (r0 << 8) | (a0 << 12) | (b1 << 16) |
                          (g1 << 20) | (r1 << 24) | (a1 << 28);
    dst_rgb += 4;
    src_argb += 8;
  }
  if (width & 1) {
    uint8 b0 = src_argb[0] >> 4;
    uint8 g0 = src_argb[1] >> 4;
    uint8 r0 = src_argb[2] >> 4;
    uint8 a0 = src_argb[3] >> 4;
    *(uint16*)(dst_rgb) = b0 | (g0 << 4) | (r0 << 8) | (a0 << 12);
  }
}